

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_compressBlock_btlazy2_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *iEnd;
  undefined8 *puVar1;
  BYTE *pBVar2;
  ZSTD_matchState_t *pZVar3;
  seqDef *psVar4;
  int iVar5;
  bool bVar6;
  undefined8 uVar7;
  uint uVar8;
  uint uVar9;
  size_t sVar10;
  size_t sVar11;
  int *piVar12;
  int *piVar13;
  BYTE *pBVar14;
  BYTE *pBVar15;
  int *piVar16;
  long lVar17;
  ulong uVar18;
  int *piVar19;
  uint uVar20;
  BYTE *pBVar21;
  uint uVar22;
  U32 UVar23;
  int iVar24;
  size_t sVar25;
  size_t offsetFound;
  int *local_b0;
  size_t local_a0;
  int *local_98;
  ulong local_90;
  uint local_84;
  int *local_80;
  BYTE *local_78;
  int *local_70;
  uint local_64;
  BYTE *local_60;
  BYTE *local_58;
  ZSTD_matchState_t *local_50;
  int *local_48;
  BYTE *local_40;
  uint *local_38;
  
  pBVar2 = (ms->window).base;
  local_84 = (ms->window).dictLimit;
  uVar18 = (ulong)local_84;
  local_78 = pBVar2 + uVar18;
  uVar9 = *rep;
  pZVar3 = ms->dictMatchState;
  local_80 = (int *)(pZVar3->window).nextSrc;
  local_60 = (pZVar3->window).base;
  local_40 = local_60 + (pZVar3->window).dictLimit;
  uVar8 = ((int)src - ((int)local_40 + (int)local_78)) + (int)local_80;
  local_50 = ms;
  if (uVar8 < uVar9) {
    __assert_fail("offset_1 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x417a,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  piVar19 = (int *)((long)src + (ulong)(uVar8 == 0));
  uVar20 = rep[1];
  if (uVar8 < uVar20) {
    __assert_fail("offset_2 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x417b,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  iEnd = (int *)((long)src + srcSize);
  local_70 = (int *)((long)src + (srcSize - 8));
  local_98 = (int *)src;
  if (piVar19 < local_70) {
    local_84 = ((int)local_60 - (int)local_80) + local_84;
    local_58 = local_60 + -(ulong)local_84;
    local_48 = iEnd + -8;
    local_90 = uVar18;
    local_38 = rep;
    do {
      iVar24 = (int)pBVar2;
      uVar8 = (((int)piVar19 - iVar24) - uVar9) + 1;
      uVar22 = (uint)uVar18;
      piVar16 = (int *)(pBVar2 + uVar8);
      if (uVar8 < uVar22) {
        piVar16 = (int *)(local_60 + (uVar8 - local_84));
      }
      local_64 = uVar20;
      if ((uVar8 - uVar22 < 0xfffffffd) && (*piVar16 == *(int *)((long)piVar19 + 1))) {
        piVar12 = iEnd;
        if (uVar8 < uVar22) {
          piVar12 = local_80;
        }
        sVar10 = ZSTD_count_2segments
                           ((BYTE *)((long)piVar19 + 5),(BYTE *)(piVar16 + 1),(BYTE *)iEnd,
                            (BYTE *)piVar12,local_78);
        uVar18 = sVar10 + 4;
      }
      else {
        uVar18 = 0;
      }
      local_a0 = 999999999;
      sVar11 = ZSTD_BtFindBestMatch_dictMatchState_selectMLS
                         (local_50,(BYTE *)piVar19,(BYTE *)iEnd,&local_a0);
      sVar10 = uVar18;
      if (uVar18 < sVar11) {
        sVar10 = sVar11;
      }
      if (sVar10 < 4) {
        piVar19 = (int *)((long)piVar19 + ((long)piVar19 - (long)local_98 >> 8) + 1);
        uVar18 = local_90;
        uVar20 = local_64;
      }
      else {
        local_b0 = piVar19;
        sVar25 = local_a0;
        if (sVar11 <= uVar18) {
          local_b0 = (int *)((long)piVar19 + 1);
          sVar25 = 0;
        }
        if (piVar19 < local_70) {
          do {
            piVar16 = (int *)((long)piVar19 + 1);
            uVar8 = ((int)piVar16 - iVar24) - uVar9;
            uVar20 = (uint)local_90;
            piVar12 = (int *)(pBVar2 + uVar8);
            if (uVar8 < uVar20) {
              piVar12 = (int *)(local_60 + (uVar8 - local_84));
            }
            if ((uVar8 - uVar20 < 0xfffffffd) && (*piVar12 == *piVar16)) {
              piVar13 = iEnd;
              if (uVar8 < uVar20) {
                piVar13 = local_80;
              }
              sVar11 = ZSTD_count_2segments
                                 ((BYTE *)((long)piVar19 + 5),(BYTE *)(piVar12 + 1),(BYTE *)iEnd,
                                  (BYTE *)piVar13,local_78);
              uVar8 = (int)sVar25 + 1;
              if (uVar8 == 0) goto LAB_001450bb;
              if (sVar11 < 0xfffffffffffffffc) {
                uVar20 = 0x1f;
                if (uVar8 != 0) {
                  for (; uVar8 >> uVar20 == 0; uVar20 = uVar20 - 1) {
                  }
                }
                if ((int)((uVar20 ^ 0x1f) + (int)sVar10 * 3 + -0x1e) < (int)(sVar11 + 4) * 3) {
                  sVar25 = 0;
                  sVar10 = sVar11 + 4;
                  local_b0 = piVar16;
                }
              }
            }
            local_a0 = 999999999;
            sVar11 = ZSTD_BtFindBestMatch_dictMatchState_selectMLS
                               (local_50,(BYTE *)piVar16,(BYTE *)iEnd,&local_a0);
            uVar8 = (int)local_a0 + 1;
            if ((uVar8 == 0) || (uVar20 = (int)sVar25 + 1, uVar20 == 0)) {
LAB_001450bb:
              __assert_fail("val != 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x12c2,"U32 ZSTD_highbit32(U32)");
            }
            bVar6 = true;
            if (3 < sVar11) {
              iVar5 = 0x1f;
              if (uVar8 != 0) {
                for (; uVar8 >> iVar5 == 0; iVar5 = iVar5 + -1) {
                }
              }
              uVar8 = 0x1f;
              if (uVar20 != 0) {
                for (; uVar20 >> uVar8 == 0; uVar8 = uVar8 - 1) {
                }
              }
              if ((int)((uVar8 ^ 0x1f) + (int)sVar10 * 4 + -0x1b) < (int)sVar11 * 4 - iVar5) {
                bVar6 = false;
                sVar25 = local_a0;
                sVar10 = sVar11;
                local_b0 = piVar16;
              }
            }
            if (bVar6) {
              if (local_70 <= piVar16) break;
              piVar16 = (int *)((long)piVar19 + 2);
              uVar8 = ((int)piVar16 - iVar24) - uVar9;
              uVar20 = (uint)local_90;
              piVar12 = (int *)(pBVar2 + uVar8);
              if (uVar8 < uVar20) {
                piVar12 = (int *)(local_60 + (uVar8 - local_84));
              }
              if ((uVar8 - uVar20 < 0xfffffffd) && (*piVar12 == *piVar16)) {
                piVar13 = iEnd;
                if (uVar8 < uVar20) {
                  piVar13 = local_80;
                }
                sVar11 = ZSTD_count_2segments
                                   ((BYTE *)((long)piVar19 + 6),(BYTE *)(piVar12 + 1),(BYTE *)iEnd,
                                    (BYTE *)piVar13,local_78);
                uVar8 = (int)sVar25 + 1;
                if (uVar8 == 0) goto LAB_001450bb;
                if (sVar11 < 0xfffffffffffffffc) {
                  uVar20 = 0x1f;
                  if (uVar8 != 0) {
                    for (; uVar8 >> uVar20 == 0; uVar20 = uVar20 - 1) {
                    }
                  }
                  if ((int)((uVar20 ^ 0x1f) + (int)sVar10 * 4 + -0x1e) < (int)(sVar11 + 4) * 4) {
                    sVar25 = 0;
                    sVar10 = sVar11 + 4;
                    local_b0 = piVar16;
                  }
                }
              }
              local_a0 = 999999999;
              sVar11 = ZSTD_BtFindBestMatch_dictMatchState_selectMLS
                                 (local_50,(BYTE *)piVar16,(BYTE *)iEnd,&local_a0);
              uVar8 = (int)local_a0 + 1;
              if ((uVar8 == 0) || (uVar20 = (int)sVar25 + 1, uVar20 == 0)) goto LAB_001450bb;
              bVar6 = true;
              if (3 < sVar11) {
                iVar5 = 0x1f;
                if (uVar8 != 0) {
                  for (; uVar8 >> iVar5 == 0; iVar5 = iVar5 + -1) {
                  }
                }
                uVar8 = 0x1f;
                if (uVar20 != 0) {
                  for (; uVar20 >> uVar8 == 0; uVar8 = uVar8 - 1) {
                  }
                }
                if ((int)((uVar8 ^ 0x1f) + (int)sVar10 * 4 + -0x18) < (int)sVar11 * 4 - iVar5) {
                  bVar6 = false;
                  sVar25 = local_a0;
                  sVar10 = sVar11;
                  local_b0 = piVar16;
                }
              }
              if (bVar6) break;
            }
            piVar19 = piVar16;
          } while (piVar16 < local_70);
        }
        if (sVar25 == 0) {
          UVar23 = 1;
          uVar8 = uVar9;
          uVar20 = local_64;
        }
        else {
          pBVar14 = (BYTE *)((long)local_b0 + (-(long)pBVar2 - sVar25) + -0xfffffffe);
          pBVar15 = pBVar2;
          pBVar21 = local_78;
          if ((uint)pBVar14 < (uint)local_90) {
            pBVar15 = local_58;
            pBVar21 = local_40;
          }
          if ((local_98 < local_b0) &&
             (uVar18 = (ulong)pBVar14 & 0xffffffff, pBVar21 < pBVar15 + uVar18)) {
            pBVar15 = pBVar15 + uVar18;
            do {
              piVar19 = (int *)((long)local_b0 + -1);
              pBVar15 = pBVar15 + -1;
              if ((*(BYTE *)piVar19 != *pBVar15) ||
                 (sVar10 = sVar10 + 1, local_b0 = piVar19, piVar19 <= local_98)) break;
            } while (pBVar21 < pBVar15);
          }
          UVar23 = (int)sVar25 + 1;
          uVar8 = (int)sVar25 - 2;
          uVar20 = uVar9;
        }
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_001450da:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x2038,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < seqStore->maxNbLit) {
LAB_001450f9:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203a,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar18 = (long)local_b0 - (long)local_98;
        pBVar21 = seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < pBVar21 + uVar18) {
LAB_00145137:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (iEnd < local_b0) {
LAB_00145118:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203c,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_48 < local_b0) {
          ZSTD_safecopyLiterals(pBVar21,(BYTE *)local_98,(BYTE *)local_b0,(BYTE *)local_48);
        }
        else {
          uVar7 = *(undefined8 *)(local_98 + 2);
          *(undefined8 *)pBVar21 = *(undefined8 *)local_98;
          *(undefined8 *)(pBVar21 + 8) = uVar7;
          if (0x10 < uVar18) {
            pBVar15 = seqStore->lit;
            pBVar21 = pBVar15 + 0x10;
            piVar19 = local_98 + 4;
            if ((BYTE *)0xffffffffffffffe8 < pBVar21 + (-8 - (long)piVar19)) {
              __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1268,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            if ((BYTE *)0xffffffffffffffe0 < pBVar21 + (-0x10 - (long)piVar19)) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1270,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar7 = *(undefined8 *)(local_98 + 6);
            *(undefined8 *)pBVar21 = *(undefined8 *)piVar19;
            *(undefined8 *)(pBVar15 + 0x18) = uVar7;
            if (0x20 < (long)uVar18) {
              lVar17 = 0;
              do {
                puVar1 = (undefined8 *)((long)local_98 + lVar17 + 0x20);
                uVar7 = puVar1[1];
                pBVar21 = pBVar15 + lVar17 + 0x20;
                *(undefined8 *)pBVar21 = *puVar1;
                *(undefined8 *)(pBVar21 + 8) = uVar7;
                puVar1 = (undefined8 *)((long)local_98 + lVar17 + 0x30);
                uVar7 = puVar1[1];
                *(undefined8 *)(pBVar21 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar21 + 0x18) = uVar7;
                lVar17 = lVar17 + 0x20;
              } while (pBVar21 + 0x20 < pBVar15 + uVar18);
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar18;
        if (0xffff < uVar18) {
          if (seqStore->longLengthID != 0) {
            __assert_fail("seqStorePtr->longLengthID == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x204d,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthID = 1;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        psVar4 = seqStore->sequences;
        psVar4->litLength = (U16)uVar18;
        psVar4->offset = UVar23;
        if (0xffff < sVar10 - 3) {
          if (seqStore->longLengthID != 0) {
LAB_00145156:
            __assert_fail("seqStorePtr->longLengthID == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x2058,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar4 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar4->matchLength = (U16)(sVar10 - 3);
        seqStore->sequences = psVar4 + 1;
        piVar19 = (int *)((long)local_b0 + sVar10);
        pBVar21 = local_58;
        uVar18 = local_90;
        local_98 = piVar19;
        do {
          uVar9 = uVar8;
          if (local_70 < piVar19) break;
          uVar9 = ((int)piVar19 - iVar24) - uVar20;
          uVar22 = (uint)uVar18;
          pBVar15 = pBVar2;
          if (uVar9 < uVar22) {
            pBVar15 = pBVar21;
          }
          if ((uVar9 - uVar22 < 0xfffffffd) && (*(int *)(pBVar15 + uVar9) == *piVar19)) {
            piVar16 = iEnd;
            if (uVar9 < uVar22) {
              piVar16 = local_80;
            }
            sVar10 = ZSTD_count_2segments
                               ((BYTE *)(piVar19 + 1),(BYTE *)((long)(pBVar15 + uVar9) + 4),
                                (BYTE *)iEnd,(BYTE *)piVar16,local_78);
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
            goto LAB_001450da;
            if (0x20000 < seqStore->maxNbLit) goto LAB_001450f9;
            pBVar21 = seqStore->lit;
            if (seqStore->litStart + seqStore->maxNbLit < pBVar21) goto LAB_00145137;
            if (iEnd < local_98) goto LAB_00145118;
            if (local_48 < local_98) {
              ZSTD_safecopyLiterals(pBVar21,(BYTE *)local_98,(BYTE *)local_98,(BYTE *)local_48);
            }
            else {
              uVar7 = *(undefined8 *)(local_98 + 2);
              *(undefined8 *)pBVar21 = *(undefined8 *)local_98;
              *(undefined8 *)(pBVar21 + 8) = uVar7;
            }
            psVar4 = seqStore->sequences;
            psVar4->litLength = 0;
            psVar4->offset = 1;
            if (0xffff < sVar10 + 1) {
              if (seqStore->longLengthID != 0) goto LAB_00145156;
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar4 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar4->matchLength = (U16)(sVar10 + 1);
            seqStore->sequences = psVar4 + 1;
            piVar19 = (int *)((long)piVar19 + sVar10 + 4);
            bVar6 = true;
            pBVar21 = local_58;
            uVar18 = local_90;
            uVar9 = uVar8;
            uVar8 = uVar20;
            local_98 = piVar19;
          }
          else {
            bVar6 = false;
            uVar9 = uVar20;
          }
          uVar20 = uVar9;
          uVar9 = uVar8;
        } while (bVar6);
      }
      rep = local_38;
    } while (piVar19 < local_70);
  }
  *rep = uVar9;
  rep[1] = uVar20;
  return (long)iEnd - (long)local_98;
}

Assistant:

size_t ZSTD_compressBlock_btlazy2_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_binaryTree, 2, ZSTD_dictMatchState);
}